

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeProfileInfo.cpp
# Opt level: O0

ValueType __thiscall
JITTimeProfileInfo::GetReturnType(JITTimeProfileInfo *this,OpCode opcode,ProfileId callSiteId)

{
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  undefined4 *puVar4;
  CallSiteInfo *pCVar5;
  ProfileId callSiteId_local;
  OpCode opcode_local;
  JITTimeProfileInfo *this_local;
  
  if ((opcode < ProfiledReturnTypeCallI) ||
     (((ProfiledReturnTypeCallIFlags < opcode && (opcode < ProfiledReturnTypeCallIExtended)) ||
      (ProfiledReturnTypeCallIExtendedFlags < opcode)))) {
    bVar2 = Js::DynamicProfileInfo::IsProfiledCallOp(opcode);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                         ,0xf7,"(Js::DynamicProfileInfo::IsProfiledCallOp(opcode))",
                         "Js::DynamicProfileInfo::IsProfiledCallOp(opcode)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    PVar3 = GetProfiledCallSiteCount(this);
    if (PVar3 <= callSiteId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                         ,0xf8,"(callSiteId < GetProfiledCallSiteCount())",
                         "callSiteId < GetProfiledCallSiteCount()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pCVar5 = GetCallSiteInfo(this);
    this_local._6_2_ =
         (anon_union_2_4_ea848c7b_for_ValueType_13)
         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
          &((anon_union_2_4_ea848c7b_for_ValueType_13 *)(pCVar5 + callSiteId))->field_0;
  }
  else {
    bVar2 = Js::DynamicProfileInfo::IsProfiledReturnTypeOp(opcode);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                         ,0xfb,"(Js::DynamicProfileInfo::IsProfiledReturnTypeOp(opcode))",
                         "Js::DynamicProfileInfo::IsProfiledReturnTypeOp(opcode)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    PVar3 = GetProfiledReturnTypeCount(this);
    if (PVar3 <= callSiteId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                         ,0xfc,"(callSiteId < GetProfiledReturnTypeCount())",
                         "callSiteId < GetProfiledReturnTypeCount()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local._6_2_ =
         (anon_union_2_4_ea848c7b_for_ValueType_13)
         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
          &((anon_union_2_4_ea848c7b_for_ValueType_13 *)
           ((this->m_profileData).returnTypeData + callSiteId))->field_0;
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)this_local._6_2_;
}

Assistant:

ValueType
JITTimeProfileInfo::GetReturnType(Js::OpCode opcode, Js::ProfileId callSiteId) const
{
    if (opcode < Js::OpCode::ProfiledReturnTypeCallI || (opcode > Js::OpCode::ProfiledReturnTypeCallIFlags && opcode < Js::OpCode::ProfiledReturnTypeCallIExtended) || opcode > Js::OpCode::ProfiledReturnTypeCallIExtendedFlags)
    {
        Assert(Js::DynamicProfileInfo::IsProfiledCallOp(opcode));
        AssertOrFailFast(callSiteId < GetProfiledCallSiteCount());
        return GetCallSiteInfo()[callSiteId].returnType;
    }
    Assert(Js::DynamicProfileInfo::IsProfiledReturnTypeOp(opcode));
    AssertOrFailFast(callSiteId < GetProfiledReturnTypeCount());
    return reinterpret_cast<ValueType*>(m_profileData.returnTypeData)[callSiteId];
}